

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O1

bool choc::html::HTMLElement::isCharLegal(uint32_t c)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = true;
  if ((9 < c - 0x30) && (0x19 < (c & 0xffffffdf) - 0x41)) {
    if (0x7e < c) {
      return false;
    }
    pcVar2 = (char *)memchr(" .,;:-()_+=?!$#@[]/|*%~{}\\",c,0x1a);
    bVar1 = pcVar2 != "" && pcVar2 != (char *)0x0;
  }
  return bVar1;
}

Assistant:

static bool isCharLegal (uint32_t c)
    {
        return (c >= 'a' && c <= 'z')
            || (c >= 'A' && c <= 'Z')
            || (c >= '0' && c <= '9')
            || (c < 127 && std::string_view (" .,;:-()_+=?!$#@[]/|*%~{}\\").find ((char) c) != std::string_view::npos);
    }